

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm_lib.c
# Opt level: O0

void libdef_rec(BuildCtx *ctx,char *p,int arg)

{
  uint32_t uVar1;
  char *pcVar2;
  undefined4 in_EDX;
  char *in_RSI;
  long in_RDI;
  uint32_t n;
  char *q;
  char *local_20;
  undefined4 in_stack_ffffffffffffffe8;
  char *local_10;
  
  if (*(int *)(in_RDI + 8) == 8) {
    for (; recffid + 1 < ffid; recffid = recffid + 1) {
      fprintf(*(FILE **)(in_RDI + 0x10),",\n0");
    }
    recffid = ffid;
    local_10 = in_RSI;
    if (*in_RSI == '.') {
      local_10 = funcname;
    }
    pcVar2 = strchr(local_10,0x20);
    local_20 = pcVar2;
    if (pcVar2 != (char *)0x0) {
      local_20 = pcVar2 + 1;
      *pcVar2 = '\0';
    }
    uVar1 = find_rec((char *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
    if (local_20 == (char *)0x0) {
      fprintf(*(FILE **)(in_RDI + 0x10),",\n0x%02x00",(ulong)uVar1);
    }
    else {
      fprintf(*(FILE **)(in_RDI + 0x10),",\n0x%02x00+(%s)",(ulong)uVar1,local_20);
    }
  }
  return;
}

Assistant:

static void libdef_rec(BuildCtx *ctx, char *p, int arg)
{
  UNUSED(arg);
  if (ctx->mode == BUILD_recdef) {
    char *q;
    uint32_t n;
    for (; recffid+1 < ffid; recffid++)
      fprintf(ctx->fp, ",\n0");
    recffid = ffid;
    if (*p == '.') p = funcname;
    q = strchr(p, ' ');
    if (q) *q++ = '\0';
    n = find_rec(p);
    if (q)
      fprintf(ctx->fp, ",\n0x%02x00+(%s)", n, q);
    else
      fprintf(ctx->fp, ",\n0x%02x00", n);
  }
}